

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O3

void __thiscall KDReports::Test::testFirstLast(Test *this)

{
  char cVar1;
  Header *pHVar2;
  Header *pHVar3;
  char *pcVar4;
  char *pcVar5;
  void *pvVar6;
  Header *pHVar7;
  Header *t1;
  int iVar8;
  bool bVar9;
  Report report;
  long local_38;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  pHVar2 = (Header *)KDReports::Report::header(&report,1);
  if (*(long *)(local_38 + 0x78) == 0) {
    bVar9 = false;
  }
  else {
    bVar9 = *(long *)(*(long *)(local_38 + 0x78) + 0x30) != 0;
  }
  cVar1 = QTest::qVerify(bVar9,"!headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x40);
  if (cVar1 != '\0') {
    iVar8 = (int)local_38 + 0x78;
    pHVar3 = (Header *)KDReports::HeaderMap::headerForPage(iVar8,1);
    pcVar4 = (char *)QTest::toString(pHVar3);
    pcVar5 = (char *)QTest::toString(pHVar2);
    cVar1 = QTest::compare_helper
                      (pHVar3 == pHVar2,"Compared pointers are not the same",pcVar4,pcVar5,
                       "headers.headerForPage(1, 1)","&firstHeader",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x41);
    if (cVar1 != '\0') {
      pHVar3 = (Header *)KDReports::HeaderMap::headerForPage(iVar8,1);
      pcVar4 = (char *)QTest::toString(pHVar3);
      pcVar5 = (char *)QTest::toString(pHVar2);
      cVar1 = QTest::compare_helper
                        (pHVar3 == pHVar2,"Compared pointers are not the same",pcVar4,pcVar5,
                         "headers.headerForPage(1, 2)","&firstHeader",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x42);
      if (cVar1 != '\0') {
        pvVar6 = (void *)KDReports::HeaderMap::headerForPage(iVar8,2);
        pcVar4 = (char *)QTest::toString(pvVar6);
        pcVar5 = (char *)QTest::toString((void *)0x0);
        cVar1 = QTest::compare_helper
                          (pvVar6 == (void *)0x0,"Compared pointers are not the same",pcVar4,pcVar5,
                           "headers.headerForPage(2, 2)","( Header * )nullptr",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                           ,0x43);
        if (cVar1 != '\0') {
          pHVar3 = (Header *)KDReports::Report::header(&report,8);
          pHVar7 = (Header *)KDReports::HeaderMap::headerForPage(iVar8,1);
          pcVar4 = (char *)QTest::toString(pHVar7);
          pcVar5 = (char *)QTest::toString(pHVar2);
          cVar1 = QTest::compare_helper
                            (pHVar7 == pHVar2,"Compared pointers are not the same",pcVar4,pcVar5,
                             "headers.headerForPage(1, 1)","&firstHeader",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                             ,0x45);
          if (cVar1 != '\0') {
            pHVar7 = (Header *)KDReports::HeaderMap::headerForPage(iVar8,1);
            pcVar4 = (char *)QTest::toString(pHVar7);
            pcVar5 = (char *)QTest::toString(pHVar2);
            cVar1 = QTest::compare_helper
                              (pHVar7 == pHVar2,"Compared pointers are not the same",pcVar4,pcVar5,
                               "headers.headerForPage(1, 2)","&firstHeader",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                               ,0x46);
            if (cVar1 != '\0') {
              pHVar7 = (Header *)KDReports::HeaderMap::headerForPage(iVar8,2);
              bVar9 = QTest::qCompare<KDReports::Header>
                                (pHVar7,pHVar3,"headers.headerForPage(2, 2)","&lastHeader",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                 ,0x47);
              if (bVar9) {
                pHVar7 = (Header *)KDReports::HeaderMap::headerForPage(iVar8,2);
                bVar9 = QTest::qCompare<KDReports::Header>
                                  (pHVar7,(Header *)0x0,"headers.headerForPage(2, 3)",
                                   "( Header * )nullptr",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                   ,0x48);
                if (bVar9) {
                  pHVar7 = (Header *)KDReports::Report::header(&report,6);
                  t1 = (Header *)KDReports::HeaderMap::headerForPage(iVar8,1);
                  bVar9 = QTest::qCompare<KDReports::Header>
                                    (t1,pHVar2,"headers.headerForPage(1, 1)","&firstHeader",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                     ,0x4a);
                  if (bVar9) {
                    pHVar2 = (Header *)KDReports::HeaderMap::headerForPage(iVar8,2);
                    bVar9 = QTest::qCompare<KDReports::Header>
                                      (pHVar2,pHVar3,"headers.headerForPage(2, 2)","&lastHeader",
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                       ,0x4b);
                    if (bVar9) {
                      pHVar2 = (Header *)KDReports::HeaderMap::headerForPage(iVar8,3);
                      bVar9 = QTest::qCompare<KDReports::Header>
                                        (pHVar2,pHVar3,"headers.headerForPage(3, 3)","&lastHeader",
                                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                         ,0x4c);
                      if (bVar9) {
                        pHVar2 = (Header *)KDReports::HeaderMap::headerForPage(iVar8,2);
                        QTest::qCompare<KDReports::Header>
                                  (pHVar2,pHVar7,"headers.headerForPage(2, 3)","&normalHeader",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                   ,0x4d);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testFirstLast()
    {
        Report report;
        Header &firstHeader = report.header(FirstPage);
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(!headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 1), &firstHeader);
        QCOMPARE(headers.headerForPage(1, 2), &firstHeader);
        QCOMPARE(headers.headerForPage(2, 2), ( Header * )nullptr);
        Header &lastHeader = report.header(LastPage);
        QCOMPARE(headers.headerForPage(1, 1), &firstHeader); // only one page -> use first header
        QCOMPARE(headers.headerForPage(1, 2), &firstHeader); // unchanged
        QCOMPARE(headers.headerForPage(2, 2), &lastHeader);
        QCOMPARE(headers.headerForPage(2, 3), ( Header * )nullptr);
        Header &normalHeader = report.header(AllPages);
        QCOMPARE(headers.headerForPage(1, 1), &firstHeader); // unchanged
        QCOMPARE(headers.headerForPage(2, 2), &lastHeader); // unchanged
        QCOMPARE(headers.headerForPage(3, 3), &lastHeader);
        QCOMPARE(headers.headerForPage(2, 3), &normalHeader);
    }